

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O2

void __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_bidirectional::ResourceMap,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>_>
::create_maps(BellmanFord<lemon::SmartDigraph,_bidirectional::ResourceMap,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>_>
              *this)

{
  PredMap *pPVar1;
  DistMap *pDVar2;
  NodeMap<bool> *this_00;
  
  if (this->_pred == (PredMap *)0x0) {
    this->_local_pred = true;
    pPVar1 = BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>::
             createPredMap(this->_gr);
    this->_pred = pPVar1;
  }
  if (this->_dist == (DistMap *)0x0) {
    this->_local_dist = true;
    pDVar2 = BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>::
             createDistMap(this->_gr);
    this->_dist = pDVar2;
  }
  if (this->_mask == (MaskMap *)0x0) {
    this_00 = (NodeMap<bool> *)operator_new(0x40);
    DigraphExtender<lemon::SmartDigraphBase>::NodeMap<bool>::NodeMap
              (this_00,&this->_gr->super_ExtendedSmartDigraphBase);
    this->_mask = this_00;
  }
  return;
}

Assistant:

void create_maps() {
    if (!_pred) {
      _local_pred = true;
      _pred       = Traits::createPredMap(*_gr);
    }
    if (!_dist) {
      _local_dist = true;
      _dist       = Traits::createDistMap(*_gr);
    }
    if (!_mask) {
      _mask = new MaskMap(*_gr);
    }
  }